

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O0

void anon_unknown.dwarf_71625::findEdgePoints<double>
               (vector<double,_std::allocator<double>_> *positive,
               vector<double,_std::allocator<double>_> *negative,
               vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second,EdgeParameter *edgeParameter,
               bool forwardDirection)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  byte bVar1;
  vector<double,_std::allocator<double>_> *in_RCX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_R9;
  byte in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000048;
  vector<double,_std::allocator<double>_> *in_stack_00000050;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc8;
  
  bVar1 = in_stack_00000008 & 1;
  getDerivatives((vector<int,_std::allocator<int>_> *)positive,
                 (vector<int,_std::allocator<int>_> *)negative,data);
  getEdgePoints<double>
            (in_stack_00000050,in_stack_00000048,(vector<int,_std::allocator<int>_> *)positive,
             (vector<int,_std::allocator<int>_> *)negative,(EdgeParameter *)data);
  removeSimilarPoints<double>(in_RSI);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffffb8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffffb8);
  __last._M_current._7_1_ = bVar1;
  __last._M_current._0_7_ = in_stack_ffffffffffffffc8;
  std::reverse<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (in_R9,__last);
  getDerivatives((vector<int,_std::allocator<int>_> *)positive,
                 (vector<int,_std::allocator<int>_> *)negative,data);
  getEdgePoints<double>
            (in_stack_00000050,in_stack_00000048,(vector<int,_std::allocator<int>_> *)positive,
             (vector<int,_std::allocator<int>_> *)negative,(EdgeParameter *)data);
  removeSimilarPoints<double>(in_RSI);
  if ((((bVar1 & 1) == 0) || (in_R9._M_current[2] != 7)) &&
     (((bVar1 & 1) != 0 || (in_R9._M_current[2] != 8)))) {
    if ((((bVar1 & 1) != 0) && (in_R9._M_current[2] == 8)) ||
       (((bVar1 & 1) == 0 && (in_R9._M_current[2] == 7)))) {
      leaveLastElement<double>(in_RCX);
      leaveFirstElement<double>((vector<double,_std::allocator<double>_> *)0x132c71);
    }
  }
  else {
    leaveFirstElement<double>((vector<double,_std::allocator<double>_> *)0x132c2d);
    leaveLastElement<double>(in_RCX);
  }
  return;
}

Assistant:

void findEdgePoints( std::vector < _Type > & positive, std::vector < _Type > & negative, std::vector < int > & data,
                         std::vector < int > & first, std::vector < int > & second, const EdgeParameter & edgeParameter, bool forwardDirection )
    {
        getDerivatives( data, first, second );
        getEdgePoints( positive, data, first, second, edgeParameter );
        removeSimilarPoints( positive );

        std::reverse( data.begin(), data.end() );
        getDerivatives( data, first, second );
        getEdgePoints( negative, data, first, second, edgeParameter );
        removeSimilarPoints( negative );
        if ( (forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::LAST) ) {
            leaveFirstElement( positive );
            leaveLastElement( negative );
        }
        else if ( (forwardDirection && edgeParameter.edge == EdgeParameter::LAST) || (!forwardDirection && edgeParameter.edge == EdgeParameter::FIRST) ) {
            leaveLastElement( positive );
            leaveFirstElement( negative );
        }
    }